

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpDebugOut.c
# Opt level: O0

void printFmt(MessageType type,char *format,__va_list_tag *args)

{
  FILE *__stream;
  FILE *out;
  __va_list_tag *args_local;
  char *format_local;
  MessageType type_local;
  
  __stream = (FILE *)getOutFile(type);
  if (type == MESSAGETYPE_ERROR) {
    fprintf(__stream,"FATAL ERROR: ");
  }
  vfprintf(__stream,format,args);
  if (type == MESSAGETYPE_ERROR) {
    putc(10,__stream);
    fflush(__stream);
  }
  return;
}

Assistant:

void printFmt (MessageType type, const char* format, va_list args)
{
	FILE* out = getOutFile(type);

	if (type == MESSAGETYPE_ERROR)
		fprintf(out, "FATAL ERROR: ");

	vfprintf(out, format, args);

	if (type == MESSAGETYPE_ERROR)
	{
		putc('\n', out);
		fflush(out);
	}
}